

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_warp_plane_sse4.c
# Opt level: O0

void highbd_filter_src_pixels
               (__m128i *src,__m128i *src2,__m128i *tmp,__m128i *coeff,int offset_bits_horiz,
               int reduce_bits_horiz,int k)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  int iVar7;
  undefined1 (*in_RCX) [16];
  long in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  byte in_R8B;
  uint in_R9D;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i res_2;
  __m128i res_0;
  __m128i round_const;
  __m128i src2_1;
  __m128i src_1;
  byte local_2f0;
  undefined8 local_1d8;
  int local_148;
  int iStack_144;
  int iStack_140;
  int iStack_13c;
  int local_138;
  int iStack_134;
  int iStack_130;
  int iStack_12c;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_118;
  int iStack_114;
  int iStack_110;
  int iStack_10c;
  int local_c8;
  int iStack_c4;
  int iStack_c0;
  int iStack_bc;
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  int iStack_9c;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  __m128i res_odd;
  __m128i res_7;
  __m128i res_5;
  __m128i res_3;
  __m128i res_1;
  __m128i res_even;
  __m128i res_6;
  __m128i res_4;
  
  local_2f0 = (byte)in_R9D;
  iVar7 = (1 << (in_R8B & 0x1f)) + ((1 << (local_2f0 & 0x1f)) >> 1);
  auVar8 = pmaddwd(*in_RDI,*in_RCX);
  auVar1._16_16_ = *in_RSI;
  auVar1._0_16_ = *in_RDI;
  auVar9 = pmaddwd(auVar1._4_16_,in_RCX[2]);
  auVar10._8_8_ = *(undefined8 *)(*in_RDI + 8);
  auVar10._0_8_ = local_1d8;
  auVar10 = pmaddwd(auVar10,in_RCX[4]);
  auVar2._16_16_ = *in_RSI;
  auVar2._0_16_ = *in_RDI;
  auVar11 = pmaddwd(auVar2._12_16_,in_RCX[6]);
  local_98 = auVar8._0_4_;
  iStack_94 = auVar8._4_4_;
  iStack_90 = auVar8._8_4_;
  iStack_8c = auVar8._12_4_;
  local_a8 = auVar10._0_4_;
  iStack_a4 = auVar10._4_4_;
  iStack_a0 = auVar10._8_4_;
  iStack_9c = auVar10._12_4_;
  local_b8 = auVar9._0_4_;
  iStack_b4 = auVar9._4_4_;
  iStack_b0 = auVar9._8_4_;
  iStack_ac = auVar9._12_4_;
  local_c8 = auVar11._0_4_;
  iStack_c4 = auVar11._4_4_;
  iStack_c0 = auVar11._8_4_;
  iStack_bc = auVar11._12_4_;
  auVar8 = ZEXT416(in_R9D);
  auVar3._16_16_ = *in_RSI;
  auVar3._0_16_ = *in_RDI;
  auVar10 = pmaddwd(auVar3._2_16_,in_RCX[1]);
  auVar4._16_16_ = *in_RSI;
  auVar4._0_16_ = *in_RDI;
  auVar9 = pmaddwd(auVar4._6_16_,in_RCX[3]);
  auVar5._16_16_ = *in_RSI;
  auVar5._0_16_ = *in_RDI;
  auVar11 = pmaddwd(auVar5._10_16_,in_RCX[5]);
  auVar6._16_16_ = *in_RSI;
  auVar6._0_16_ = *in_RDI;
  auVar12 = pmaddwd(auVar6._14_16_,in_RCX[7]);
  local_118 = auVar10._0_4_;
  iStack_114 = auVar10._4_4_;
  iStack_110 = auVar10._8_4_;
  iStack_10c = auVar10._12_4_;
  local_128 = auVar11._0_4_;
  iStack_124 = auVar11._4_4_;
  iStack_120 = auVar11._8_4_;
  iStack_11c = auVar11._12_4_;
  local_138 = auVar9._0_4_;
  iStack_134 = auVar9._4_4_;
  iStack_130 = auVar9._8_4_;
  iStack_12c = auVar9._12_4_;
  local_148 = auVar12._0_4_;
  iStack_144 = auVar12._4_4_;
  iStack_140 = auVar12._8_4_;
  iStack_13c = auVar12._12_4_;
  auVar10 = ZEXT416(in_R9D);
  auVar9._4_4_ = iStack_94 + iStack_a4 + iStack_b4 + iStack_c4 + iVar7 >> auVar8;
  auVar9._0_4_ = local_98 + local_a8 + local_b8 + local_c8 + iVar7 >> auVar8;
  auVar9._12_4_ = iStack_8c + iStack_9c + iStack_ac + iStack_bc + iVar7 >> auVar8;
  auVar9._8_4_ = iStack_90 + iStack_a0 + iStack_b0 + iStack_c0 + iVar7 >> auVar8;
  auVar8._4_4_ = iStack_114 + iStack_124 + iStack_134 + iStack_144 + iVar7 >> auVar10;
  auVar8._0_4_ = local_118 + local_128 + local_138 + local_148 + iVar7 >> auVar10;
  auVar8._12_4_ = iStack_10c + iStack_11c + iStack_12c + iStack_13c + iVar7 >> auVar10;
  auVar8._8_4_ = iStack_110 + iStack_120 + iStack_130 + iStack_140 + iVar7 >> auVar10;
  auVar10 = packssdw(auVar9,auVar8);
  *(undefined1 (*) [16])(in_RDX + (long)((int)res_2[1] + 7) * 0x10) = auVar10;
  return;
}

Assistant:

static inline void highbd_filter_src_pixels(
    const __m128i *src, const __m128i *src2, __m128i *tmp, __m128i *coeff,
    const int offset_bits_horiz, const int reduce_bits_horiz, int k) {
  const __m128i src_1 = *src;
  const __m128i src2_1 = *src2;

  const __m128i round_const = _mm_set1_epi32((1 << offset_bits_horiz) +
                                             ((1 << reduce_bits_horiz) >> 1));

  const __m128i res_0 = _mm_madd_epi16(src_1, coeff[0]);
  const __m128i res_2 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 4), coeff[2]);
  const __m128i res_4 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 8), coeff[4]);
  const __m128i res_6 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 12), coeff[6]);

  __m128i res_even =
      _mm_add_epi32(_mm_add_epi32(res_0, res_4), _mm_add_epi32(res_2, res_6));
  res_even = _mm_sra_epi32(_mm_add_epi32(res_even, round_const),
                           _mm_cvtsi32_si128(reduce_bits_horiz));

  const __m128i res_1 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 2), coeff[1]);
  const __m128i res_3 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 6), coeff[3]);
  const __m128i res_5 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 10), coeff[5]);
  const __m128i res_7 =
      _mm_madd_epi16(_mm_alignr_epi8(src2_1, src_1, 14), coeff[7]);

  __m128i res_odd =
      _mm_add_epi32(_mm_add_epi32(res_1, res_5), _mm_add_epi32(res_3, res_7));
  res_odd = _mm_sra_epi32(_mm_add_epi32(res_odd, round_const),
                          _mm_cvtsi32_si128(reduce_bits_horiz));

  // Combine results into one register.
  // We store the columns in the order 0, 2, 4, 6, 1, 3, 5, 7
  // as this order helps with the vertical filter.
  tmp[k + 7] = _mm_packs_epi32(res_even, res_odd);
}